

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O2

void __thiscall
discordpp::ApplicationCommandOption::ApplicationCommandOption
          (ApplicationCommandOption *this,field<discordpp::ApplicationCommandOptionType> *type,
          field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *name,nullable_omittable_field<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *name_localizations,
          field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *description,
          nullable_omittable_field<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *description_localizations,omittable_field<bool> *required,
          omittable_field<std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>_>
          *choices,omittable_field<std::vector<discordpp::ApplicationCommandOption,_std::allocator<discordpp::ApplicationCommandOption>_>_>
                   *options,
          omittable_field<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_>
          *channel_types,omittable_field<std::variant<int,_double>_> *min_value,
          omittable_field<std::variant<int,_double>_> *max_value,omittable_field<int> *min_length,
          omittable_field<int> *max_length,omittable_field<bool> *autocomplete)

{
  field<discordpp::ApplicationCommandOptionType>::field(&this->type,type);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->name,name);
  nullable_omittable_field<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::nullable_omittable_field(&this->name_localizations,name_localizations);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->description,description);
  nullable_omittable_field<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::nullable_omittable_field(&this->description_localizations,description_localizations);
  omittable_field<bool>::omittable_field(&this->required,required);
  omittable_field<std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>_>
  ::omittable_field(&this->choices,choices);
  omittable_field<std::vector<discordpp::ApplicationCommandOption,_std::allocator<discordpp::ApplicationCommandOption>_>_>
  ::omittable_field(&this->options,options);
  omittable_field<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_>::
  omittable_field(&this->channel_types,channel_types);
  omittable_field<std::variant<int,_double>_>::omittable_field(&this->min_value,min_value);
  omittable_field<std::variant<int,_double>_>::omittable_field(&this->max_value,max_value);
  omittable_field<int>::omittable_field(&this->min_length,min_length);
  omittable_field<int>::omittable_field(&this->max_length,max_length);
  omittable_field<bool>::omittable_field(&this->autocomplete,autocomplete);
  return;
}

Assistant:

ApplicationCommandOption(
        field<ApplicationCommandOptionType> type = uninitialized,
        field<std::string> name = uninitialized,
        nullable_omittable_field<std::map<Locale, std::string>> name_localizations = omitted,
        field<std::string> description = uninitialized,
        nullable_omittable_field<std::map<Locale, std::string>> description_localizations = omitted,
        omittable_field<bool> required = omitted,
        omittable_field<std::vector<ApplicationCommandOptionChoice> > choices = omitted,
        omittable_field<std::vector<ApplicationCommandOption> > options = omitted,
        omittable_field<std::vector<ChannelType> > channel_types = omitted,
        omittable_field<std::variant<int, double>> min_value = omitted,
        omittable_field<std::variant<int, double>> max_value = omitted,
        omittable_field<int> min_length = omitted,
        omittable_field<int> max_length = omitted,
        omittable_field<bool> autocomplete = omitted
    ):
        type(type),
        name(name),
        name_localizations(name_localizations),
        description(description),
        description_localizations(description_localizations),
        required(required),
        choices(choices),
        options(options),
        channel_types(channel_types),
        min_value(min_value),
        max_value(max_value),
        min_length(min_length),
        max_length(max_length),
        autocomplete(autocomplete)
    {}